

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

RecyclableObject * Js::JavascriptOperators::ToObject(Var aRight,ScriptContext *scriptContext)

{
  RecyclableObject *pRVar1;
  BOOL BVar2;
  ThreadContext *threadContext;
  RecyclableObject *local_40;
  RecyclableObject *object;
  JsReentLock reentrancylock;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  
  reentrancylock._24_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)&object,threadContext);
  local_40 = (RecyclableObject *)0x0;
  BVar2 = JavascriptConversion::ToObject(aRight,(ScriptContext *)reentrancylock._24_8_,&local_40);
  pRVar1 = local_40;
  if (BVar2 == 0) {
    JavascriptError::ThrowTypeError((ScriptContext *)reentrancylock._24_8_,-0x7ff5ec71,(PCWSTR)0x0);
  }
  JsReentLock::~JsReentLock((JsReentLock *)&object);
  return pRVar1;
}

Assistant:

RecyclableObject* JavascriptOperators::ToObject(Var aRight, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_ConvObject, reentrancylock, scriptContext->GetThreadContext());
        RecyclableObject* object = nullptr;
        if (FALSE == JavascriptConversion::ToObject(aRight, scriptContext, &object))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject /* TODO-ERROR: get arg name - aValue */);
        }

        return object;
        JIT_HELPER_END(Op_ConvObject);
    }